

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O0

int __thiscall
pybind11::detail::process_attribute<pybind11::arg,_void>::init
          (process_attribute<pybind11::arg,_void> *this,EVP_PKEY_CTX *ctx)

{
  function_record *__args;
  bool bVar1;
  int extraout_EAX;
  vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
  *pvVar2;
  bool local_42;
  bool local_41;
  handle local_40;
  void *local_38;
  bool local_2a;
  bool local_29;
  handle local_28;
  void *local_20;
  EVP_PKEY_CTX *local_18;
  function_record *r_local;
  arg *a_local;
  
  local_18 = ctx;
  r_local = (function_record *)this;
  if ((((byte)ctx[0x59] >> 6 & 1) != 0) &&
     (bVar1 = std::
              vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
              ::empty((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                       *)(ctx + 0x18)), bVar1)) {
    pvVar2 = (vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
              *)(local_18 + 0x18);
    local_20 = (void *)0x0;
    memset(&local_28,0,8);
    handle::handle(&local_28);
    local_29 = true;
    local_2a = false;
    std::vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
    ::emplace_back<char_const(&)[5],decltype(nullptr),pybind11::handle,bool,bool>
              (pvVar2,(char (*) [5])"self",&local_20,&local_28,&local_29,&local_2a);
  }
  __args = r_local;
  pvVar2 = (vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
            *)(local_18 + 0x18);
  local_38 = (void *)0x0;
  memset(&local_40,0,8);
  handle::handle(&local_40);
  local_41 = (bool)((*(byte *)&r_local->doc & 1 ^ 0xff) & 1);
  local_42 = (bool)(*(byte *)&r_local->doc >> 1 & 1);
  std::vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>::
  emplace_back<char_const*const&,decltype(nullptr),pybind11::handle,bool,bool_const&>
            (pvVar2,&__args->name,&local_38,&local_40,&local_41,&local_42);
  return extraout_EAX;
}

Assistant:

static void init(const arg &a, function_record *r) {
        if (r->is_method && r->args.empty())
            r->args.emplace_back("self", nullptr, handle(), true /*convert*/, false /*none not allowed*/);
        r->args.emplace_back(a.name, nullptr, handle(), !a.flag_noconvert, a.flag_none);
    }